

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardReporter.cpp
# Opt level: O0

void ApprovalTests::ClipboardReporter::copyToClipboard(string *newClipboard)

{
  undefined1 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cmd;
  string clipboardCommand;
  undefined5 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff45;
  allocator in_stack_ffffffffffffff47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string local_98 [32];
  string local_78 [32];
  string local_58 [23];
  undefined1 in_stack_ffffffffffffffbf;
  string *in_stack_ffffffffffffffc0;
  string local_28 [40];
  
  ::std::__cxx11::string::string(local_28);
  uVar1 = SystemUtils::isWindowsOs();
  if ((bool)uVar1) {
    ::std::__cxx11::string::operator=(local_28,"clip");
  }
  else {
    in_stack_ffffffffffffff45 = SystemUtils::isMacOs();
    if ((bool)in_stack_ffffffffffffff45) {
      ::std::__cxx11::string::operator=(local_28,"pbcopy");
    }
    else {
      ::std::__cxx11::string::operator=(local_28,"pbclip");
    }
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff48,"echo ",(allocator *)&stack0xffffffffffffff47);
  ::std::operator+(in_stack_ffffffffffffff48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff47,
                            CONCAT16(uVar1,CONCAT15(in_stack_ffffffffffffff45,
                                                    in_stack_ffffffffffffff40))));
  ::std::operator+(in_stack_ffffffffffffff48,
                   (char *)CONCAT17(in_stack_ffffffffffffff47,
                                    CONCAT16(uVar1,CONCAT15(in_stack_ffffffffffffff45,
                                                            in_stack_ffffffffffffff40))));
  ::std::operator+(in_stack_ffffffffffffff48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff47,
                            CONCAT16(uVar1,CONCAT15(in_stack_ffffffffffffff45,
                                                    in_stack_ffffffffffffff40))));
  ::std::__cxx11::string::~string(local_78);
  ::std::__cxx11::string::~string(local_98);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  SystemUtils::runSystemCommandOrThrow(in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void ClipboardReporter::copyToClipboard(const std::string& newClipboard)
    {
        /*
     This will probably not work on Linux.

     From https://stackoverflow.com/a/750466/104370
     In case of X, yes, there's xclip (and others). xclip -selection c will send data to the clipboard that
     works with Ctrl-C, Ctrl-V in most applications.

     If you're trying to talk to the Mac OS X clipboard, there's pbcopy.

     If you're in Linux terminal mode (no X) then maybe you need to look into gpm.

     There's also GNU screen which has a clipboard. To put stuff in there, look at the screen command "readreg".

     Under Windows/cygwin, use /dev/clipboard or clip for newer versions of Windows (at least Windows 10).
     */

        std::string clipboardCommand;
        if (SystemUtils::isWindowsOs())
        {
            clipboardCommand = "clip";
        }
        else if (SystemUtils::isMacOs())
        {
            clipboardCommand = "pbcopy";
        }
        else
        {
            clipboardCommand = "pbclip";
        }
        auto cmd = std::string("echo ") + newClipboard + " | " + clipboardCommand;
        SystemUtils::runSystemCommandOrThrow(cmd);
    }